

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.c++
# Opt level: O2

bool __thiscall kj::_::Mutex::lock(Mutex *this,int exclusivity,char *timeout)

{
  uint uVar1;
  long lVar2;
  int *piVar3;
  uint uVar4;
  uint uVar5;
  anon_union_16_1_a8c68091_for_NullableValue<timespec>_2 *paVar6;
  bool bVar7;
  bool bVar8;
  Maybe<timespec> spec;
  
  spec.ptr.isSet = *timeout == '\x01';
  if (spec.ptr.isSet) {
    spec.ptr.field_1.value.tv_sec = *(long *)(timeout + 8) / 1000000000;
    spec.ptr.field_1.value.tv_nsec = *(long *)(timeout + 8) % 1000000000;
  }
  paVar6 = (anon_union_16_1_a8c68091_for_NullableValue<timespec>_2 *)0x0;
  if (spec.ptr.isSet) {
    paVar6 = &spec.ptr.field_1;
  }
  bVar7 = true;
  if (exclusivity == 1) {
    LOCK();
    uVar1 = this->futex;
    this->futex = this->futex + 1;
    UNLOCK();
    uVar5 = uVar1 + 1;
    while ((int)uVar5 < 0) {
      lVar2 = syscall(0xca,this,0x80,(ulong)uVar5,paVar6,0,0);
      if ((lVar2 < 0) && (piVar3 = __errno_location(), *piVar3 == 0x6e)) {
        LOCK();
        uVar1 = this->futex;
        this->futex = this->futex - 1;
        UNLOCK();
        if (uVar1 != 0x40000001) {
          return false;
        }
        LOCK();
        bVar7 = this->futex == 0x40000000;
        if (bVar7) {
          this->futex = 0;
        }
        UNLOCK();
        if (!bVar7) {
          return false;
        }
        syscall(0xca,this,0x81,0x7fffffff,0,0,0);
        return false;
      }
      uVar5 = this->futex;
    }
  }
  else if (exclusivity == 0) {
LAB_001c24ee:
    do {
      LOCK();
      uVar5 = this->futex;
      bVar7 = uVar5 == 0;
      if (bVar7) {
        this->futex = 0x80000000;
        uVar5 = 0;
      }
      UNLOCK();
      if (bVar7) {
        return bVar7;
      }
      uVar4 = uVar5;
      if ((uVar5 >> 0x1e & 1) == 0) {
        uVar4 = uVar5 | 0x40000000;
        LOCK();
        bVar8 = uVar5 == this->futex;
        if (bVar8) {
          this->futex = uVar4;
        }
        UNLOCK();
        if (!bVar8) goto LAB_001c24ee;
      }
      lVar2 = syscall(0xca,this,0x80,(ulong)uVar4,paVar6,0,0);
    } while ((-1 < lVar2) || (piVar3 = __errno_location(), *piVar3 != 0x6e));
  }
  return bVar7;
}

Assistant:

bool Mutex::lock(Exclusivity exclusivity, Maybe<Duration> timeout, LockSourceLocationArg location) {
  BlockedOnReason blockReason = BlockedOnMutexAcquisition{*this, location};
  KJ_DEFER(setCurrentThreadIsNoLongerWaiting());

  auto spec = timeout.map([](Duration d) { return toRelativeTimespec(d); });
  struct timespec* specp = nullptr;
  KJ_IF_SOME(s, spec) {
    specp = &s;
  }

  switch (exclusivity) {
    case EXCLUSIVE:
      for (;;) {
        uint state = 0;
        if (KJ_LIKELY(__atomic_compare_exchange_n(&futex, &state, EXCLUSIVE_HELD, false,
                                                  __ATOMIC_ACQUIRE, __ATOMIC_RELAXED))) {

          // Acquired.
          break;
        }

        // The mutex is contended.  Set the exclusive-requested bit and wait.
        if ((state & EXCLUSIVE_REQUESTED) == 0) {
          if (!__atomic_compare_exchange_n(&futex, &state, state | EXCLUSIVE_REQUESTED, false,
                                           __ATOMIC_RELAXED, __ATOMIC_RELAXED)) {
            // Oops, the state changed before we could set the request bit.  Start over.
            continue;
          }

          state |= EXCLUSIVE_REQUESTED;
        }

        setCurrentThreadIsWaitingFor(&blockReason);

        auto result = syscall(SYS_futex, &futex, FUTEX_WAIT_PRIVATE, state, specp, nullptr, 0);
        if (result < 0) {
          if (errno == ETIMEDOUT) {
            setCurrentThreadIsNoLongerWaiting();
            // We timed out, we can't remove the exclusive request flag (since others might be waiting)
            // so we just return false.
            return false;
          }
        }
      }
#if KJ_CONTENTION_WARNING_THRESHOLD
      printContendedReader = false;
#endif
      break;
    case SHARED: {
#if KJ_CONTENTION_WARNING_THRESHOLD
      kj::Maybe<kj::TimePoint> contentionWaitStart;
#endif

      uint state = __atomic_add_fetch(&futex, 1, __ATOMIC_ACQUIRE);

      for (;;) {
        if (KJ_LIKELY((state & EXCLUSIVE_HELD) == 0)) {
          // Acquired.
          break;
        }

#if KJ_CONTENTION_WARNING_THRESHOLD
        if (contentionWaitStart == kj::none) {
          // We could have the exclusive mutex tell us how long it was holding the lock. That would
          // be the nicest. However, I'm hesitant to bloat the structure. I suspect having a reader
          // tell us how long it was waiting for is probably a good proxy.
          contentionWaitStart = kj::systemPreciseMonotonicClock().now();
        }
#endif

        setCurrentThreadIsWaitingFor(&blockReason);

        // The mutex is exclusively locked by another thread.  Since we incremented the counter
        // already, we just have to wait for it to be unlocked.
        auto result = syscall(SYS_futex, &futex, FUTEX_WAIT_PRIVATE, state, specp, nullptr, 0);
        if (result < 0) {
          // If we timeout though, we need to signal that we're not waiting anymore.
          if (errno == ETIMEDOUT) {
            setCurrentThreadIsNoLongerWaiting();
            state = __atomic_sub_fetch(&futex, 1, __ATOMIC_RELAXED);

            // We may have unlocked since we timed out. So act like we just unlocked the mutex
            // and maybe send a wait signal if needed. See Mutex::unlock SHARED case.
            if (KJ_UNLIKELY(state == EXCLUSIVE_REQUESTED)) {
              if (__atomic_compare_exchange_n(
                  &futex, &state, 0, false, __ATOMIC_RELAXED, __ATOMIC_RELAXED)) {
                // Wake all exclusive waiters.  We have to wake all of them because one of them will
                // grab the lock while the others will re-establish the exclusive-requested bit.
                syscall(SYS_futex, &futex, FUTEX_WAKE_PRIVATE, INT_MAX, nullptr, nullptr, 0);
              }
            }
            return false;
          }
        }
        state = __atomic_load_n(&futex, __ATOMIC_ACQUIRE);
      }

#ifdef KJ_CONTENTION_WARNING_THRESHOLD
      KJ_IF_SOME(start, contentionWaitStart) {
        if (__atomic_load_n(&printContendedReader, __ATOMIC_RELAXED)) {
          // Double-checked lock avoids the CPU needing to acquire the lock in most cases.
          if (__atomic_exchange_n(&printContendedReader, false, __ATOMIC_RELAXED)) {
            auto contentionDuration = kj::systemPreciseMonotonicClock().now() - start;
            KJ_LOG(WARNING, "Acquired contended lock", location, contentionDuration,
                kj::getStackTrace());
          }
        }
      }
#endif

      break;
    }
  }
  return true;
}